

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string * nlohmann::detail::exception::name(string *__return_storage_ptr__,string *ename,int id_)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  pointer *ppcVar7;
  size_type *psVar8;
  ulong uVar9;
  pointer pcVar10;
  uint __len;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  pointer *local_90;
  long local_88;
  pointer local_80;
  long lStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  size_type *local_50;
  string __str;
  
  std::operator+(&local_b0,"[json.exception.",ename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  ppcVar7 = (pointer *)(plVar4 + 2);
  if ((pointer *)*plVar4 == ppcVar7) {
    local_80 = *ppcVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *ppcVar7;
    local_90 = (pointer *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)ppcVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __val = -id_;
  if (0 < id_) {
    __val = id_;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_001225d2;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_001225d2;
      }
      if (uVar6 < 10000) goto LAB_001225d2;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_001225d2:
  local_50 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(id_ >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)id_ >> 0x1f) + (long)local_50),__len,__val);
  pcVar10 = (pointer)0xf;
  if (local_90 != &local_80) {
    pcVar10 = local_80;
  }
  if (pcVar10 < __str._M_dataplus._M_p + local_88) {
    pcVar10 = (pointer)0xf;
    if (local_50 != &__str._M_string_length) {
      pcVar10 = (pointer)__str._M_string_length;
    }
    if (__str._M_dataplus._M_p + local_88 <= pcVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_0012265f;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50);
LAB_0012265f:
  local_70 = &local_60;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_60 = *puVar1;
    uStack_58 = puVar5[3];
  }
  else {
    local_60 = *puVar1;
    local_70 = (undefined8 *)*puVar5;
  }
  local_68 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return "[json.exception." + ename + "." + std::to_string(id_) + "] ";
    }